

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  Float FVar7;
  Float FVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [64];
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  float fVar20;
  float __x;
  undefined1 auVar21 [64];
  float fVar22;
  SampledSpectrum SVar23;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  auVar21._4_60_ = wi._12_60_;
  auVar21._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._8_56_ = wi._8_56_;
  auVar19._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._4_60_ = wo._12_60_;
  auVar15._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._8_56_ = wo._8_56_;
  auVar13._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58._0_8_ = vmovlps_avx(auVar13._0_16_);
  local_68._0_8_ = vmovlps_avx(auVar19._0_16_);
  uVar9 = 0;
  if ((((auVar15._0_4_ * auVar21._0_4_ <= 0.0) ||
       (auVar5 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                            ZEXT416((uint)(this->mfDistrib).alpha_x)), auVar5._0_4_ < 0.001)) ||
      ((auVar15._0_4_ == 0.0 && (!NAN(auVar15._0_4_))))) ||
     ((auVar21._0_4_ == 0.0 && (!NAN(auVar21._0_4_))))) {
    uVar16 = 0;
  }
  else {
    auVar11._0_4_ = local_68.x + local_58.x;
    auVar11._4_4_ = local_68.y + local_58.y;
    auVar11._8_8_ = 0;
    auVar5 = vmovshdup_avx(auVar11);
    fVar20 = auVar15._0_4_ + auVar21._0_4_;
    if ((fVar20 == 0.0) && (((!NAN(fVar20) && (auVar11._0_4_ == 0.0)) && (!NAN(auVar11._0_4_))))) {
      uVar16 = 0;
      if ((auVar5._0_4_ == 0.0) && (!NAN(auVar5._0_4_))) goto LAB_003f6e26;
    }
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar17._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar17._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar17._8_8_ = 0;
    auVar17 = vhaddps_avx(auVar17,auVar17);
    local_18 = vandps_avx(auVar15._0_16_,auVar10);
    local_28 = vandps_avx(auVar21._0_16_,auVar10);
    fVar22 = fVar20 * fVar20 + auVar17._0_4_;
    local_68.z = auVar21._0_4_;
    local_58.z = auVar15._0_4_;
    if (fVar22 < 0.0) {
      local_48 = auVar5;
      local_38 = auVar11;
      fVar22 = sqrtf(fVar22);
      auVar5 = local_48;
      auVar11 = local_38;
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
      fVar22 = auVar17._0_4_;
    }
    auVar18._0_4_ = auVar11._0_4_ / fVar22;
    auVar18._4_12_ = auVar11._4_12_;
    fVar14 = auVar5._0_4_ / fVar22;
    uVar9 = auVar5._8_8_;
    fVar20 = fVar20 / fVar22;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_68.y)),auVar18,ZEXT416((uint)local_68.x))
    ;
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar20),ZEXT416((uint)local_68.z));
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar5,auVar2);
    uVar16 = auVar5._8_8_;
    SVar23 = FrConductor(auVar5._0_4_,&this->eta,&this->k);
    local_38._8_8_ = uVar16;
    local_38._0_8_ = SVar23.values.values._0_8_;
    local_48._8_8_ = uVar9;
    local_48._0_8_ = SVar23.values.values._8_8_;
    fVar20 = fVar20 * fVar20;
    fVar22 = 0.0;
    auVar5 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar20)),ZEXT816(0) << 0x40);
    __x = auVar5._0_4_;
    if ((ABS(__x / fVar20) != INFINITY) && (1e-16 <= fVar20 * fVar20)) {
      if (__x < 0.0) {
        fVar22 = sqrtf(__x);
        auVar5 = ZEXT416((uint)__x);
      }
      else {
        auVar11 = vsqrtss_avx(auVar5,auVar5);
        fVar22 = auVar11._0_4_;
      }
      fVar3 = 1.0;
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(auVar18._0_4_ / fVar22)))
        ;
        uVar9 = vcmpss_avx512f(ZEXT416((uint)(auVar18._0_4_ / fVar22)),
                               SUB6416(ZEXT464(0xbf800000),0),1);
        bVar1 = (bool)((byte)uVar9 & 1);
        fVar3 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar11._0_4_);
      }
      fVar22 = (this->mfDistrib).alpha_x;
      if (auVar5._0_4_ < 0.0) {
        fVar6 = sqrtf(auVar5._0_4_);
      }
      else {
        auVar5 = vsqrtss_avx(auVar5,auVar5);
        fVar6 = auVar5._0_4_;
      }
      fVar4 = 0.0;
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        auVar11 = ZEXT416((uint)(fVar14 / fVar6));
        auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
        uVar9 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar1 = (bool)((byte)uVar9 & 1);
        fVar4 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar5._0_4_);
      }
      fVar14 = (this->mfDistrib).alpha_y;
      fVar22 = (__x / fVar20) *
               ((fVar3 * fVar3) / (fVar22 * fVar22) + (fVar4 * fVar4) / (fVar14 * fVar14)) + 1.0;
      fVar22 = 1.0 / (fVar20 * fVar20 * fVar14 * (this->mfDistrib).alpha_x * 3.1415927 *
                     fVar22 * fVar22);
    }
    FVar7 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_58);
    FVar8 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_68);
    auVar5 = vunpcklpd_avx(local_38,local_48);
    fVar22 = (1.0 / (FVar7 + 1.0 + FVar8)) * fVar22;
    auVar12._0_4_ = fVar22 * auVar5._0_4_;
    auVar12._4_4_ = fVar22 * auVar5._4_4_;
    auVar12._8_4_ = fVar22 * auVar5._8_4_;
    auVar12._12_4_ = fVar22 * auVar5._12_4_;
    fVar20 = (float)local_28._0_4_ * 4.0 * (float)local_18._0_4_;
    auVar5._4_4_ = fVar20;
    auVar5._0_4_ = fVar20;
    auVar5._8_4_ = fVar20;
    auVar5._12_4_ = fVar20;
    auVar5 = vdivps_avx(auVar12,auVar5);
    uVar9 = auVar5._0_8_;
    auVar5 = vshufpd_avx(auVar5,auVar5,1);
    uVar16 = auVar5._0_8_;
  }
LAB_003f6e26:
  SVar23.values.values[2] = (float)(int)uVar16;
  SVar23.values.values[3] = (float)(int)((ulong)uVar16 >> 0x20);
  SVar23.values.values[0] = (float)(int)uVar9;
  SVar23.values.values[1] = (float)(int)((ulong)uVar9 >> 0x20);
  return (SampledSpectrum)SVar23.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySmooth())
            return {};
        // Evaluate Torrance--Sparrow model for conductor BRDF
        // Compute cosines and $\wh$ for conductor BRDF
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        Vector3f wh = wi + wo;
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};
        wh = Normalize(wh);

        // Evaluate Fresnel factor _F_ for conductor BRDF
        Float frCosTheta_i = AbsDot(wi, wh);
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);

        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }